

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  short sVar7;
  bool bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  stbi__uint32 sVar19;
  int iVar20;
  stbi_uc asVar21 [4];
  stbi__uint32 sVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  char *pcVar27;
  void *pvVar28;
  stbi__context *psVar29;
  stbi__jpeg *psVar30;
  stbi__uint16 *psVar31;
  stbi_uc *psVar32;
  long lVar33;
  uchar *puVar34;
  code *pcVar35;
  undefined8 uVar36;
  long lVar37;
  short sVar38;
  int iVar39;
  int iVar40;
  ulong uVar41;
  int id;
  ulong uVar42;
  stbi__context *psVar43;
  int iVar44;
  undefined1 *puVar45;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar46;
  byte *pbVar47;
  stbi__result_info *ri_00;
  int iVar48;
  uint uVar49;
  stbi_uc *pal_entry;
  uint uVar50;
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  stbi_uc *psVar54;
  short *psVar55;
  stbi_uc *psVar56;
  long in_FS_OFFSET;
  bool bVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  stbi__uint16 *local_8988;
  stbi__jpeg *local_8980;
  uint local_8978;
  uint local_8950;
  stbi__jpeg *local_8948;
  uint local_890c;
  uint local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  uint uStack_88dc;
  int local_88d8;
  uint local_88c8;
  uint local_88bc;
  stbi_uc pal [256] [4];
  
  psVar56 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar16 != 0) {
    if ((uint)req_comp < 5) {
      pal._0_8_ = s;
      iVar16 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
      uVar36 = pal._0_8_;
      if (iVar16 == 0) {
        psVar29 = (stbi__context *)0x0;
      }
      else {
        if ((int)pal[8] < 9) {
          iVar16 = 8;
        }
        else {
          if (pal[8] != (stbi_uc  [4])0x10) {
            pcVar27 = "PNG not supported: unsupported color depth";
            goto LAB_001579e1;
          }
          iVar16 = 0x10;
        }
        ri->bits_per_channel = iVar16;
        if ((req_comp != 0) && (iVar16 = *(int *)(pal._0_8_ + 0xc), iVar16 != req_comp)) {
          if ((int)pal[8] < 9) {
            pal._24_8_ = stbi__convert_format
                                   ((uchar *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          else {
            pal._24_8_ = stbi__convert_format16
                                   ((stbi__uint16 *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          *(int *)(uVar36 + 0xc) = req_comp;
          if ((stbi__context *)pal._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar36;
        *y = *(int *)(uVar36 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar36 + 8);
        }
        psVar29 = (stbi__context *)pal._24_8_;
        pal._24_8_ = (void *)0x0;
      }
      free((void *)pal._24_8_);
      free((void *)pal._16_8_);
      local_8980 = (stbi__jpeg *)pal._8_8_;
      goto LAB_00157dc2;
    }
    pcVar27 = "Internal error";
    goto LAB_001579e1;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar17 = stbi__get32le(s);
    if (((0x38 < sVar17) || ((0x100010000001000U >> ((ulong)sVar17 & 0x3f) & 1) == 0)) &&
       ((sVar17 != 0x7c && (sVar17 != 0x6c)))) goto LAB_00157b64;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar28 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar28 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar18 = s->img_y;
    uVar23 = -uVar18;
    if (0 < (int)uVar18) {
      uVar23 = uVar18;
    }
    s->img_y = uVar23;
    if ((uVar23 < 0x1000001) && (s->img_x < 0x1000001)) {
      uStack_88dc = 0xff;
      if (iStack_88f0 != 0xc) {
        if ((int)value < 0x10) {
          uVar23 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
          goto LAB_00158581;
        }
LAB_001586a9:
        iVar16 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (((0xfffffbff < iVar16 - 0x401U) && (iVar16 <= iStack_88f4)) &&
           (iStack_88f4 - iVar16 < 0x401)) {
          stbi__skip(s,iStack_88f4 - iVar16);
          uVar23 = 0;
          bVar57 = true;
          if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_001585a9;
          bVar8 = true;
          iVar16 = 3;
          asVar21[0] = '\x18';
          asVar21[1] = '\0';
          asVar21[2] = '\0';
          asVar21[3] = '\0';
          bVar57 = true;
          goto LAB_001585cc;
        }
LAB_00159785:
        pcVar27 = "Corrupt BMP";
        goto LAB_001579e1;
      }
      if (0x17 < (int)value) goto LAB_001586a9;
      uVar23 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_00158581:
      if (uVar23 == 0) goto LAB_001586a9;
      bVar57 = false;
LAB_001585a9:
      bVar8 = uStack_88e0 == 0xff000000;
      iVar16 = 4 - (uint)(uStack_88e0 == 0);
      asVar21 = value;
LAB_001585cc:
      s->img_n = iVar16;
      if (2 < req_comp) {
        iVar16 = req_comp;
      }
      sVar17 = s->img_x;
      sVar19 = s->img_y;
      iVar20 = stbi__mad3sizes_valid(iVar16,sVar17,sVar19,0);
      if (iVar20 == 0) goto LAB_00159785;
      local_8980 = (stbi__jpeg *)stbi__malloc_mad3(iVar16,sVar17,sVar19,0);
      if (local_8980 != (stbi__jpeg *)0x0) {
        if ((int)asVar21 < 0x10) {
          if (!bVar57 && (int)uVar23 < 0x101) {
            uVar41 = 0;
            uVar52 = 0;
            if (0 < (int)uVar23) {
              uVar52 = (ulong)uVar23;
            }
            for (; uVar52 != uVar41; uVar41 = uVar41 + 1) {
              sVar9 = stbi__get8(s);
              pal[uVar41][2] = sVar9;
              sVar9 = stbi__get8(s);
              pal[uVar41][1] = sVar9;
              sVar9 = stbi__get8(s);
              pal[uVar41][0] = sVar9;
              if (iStack_88f0 != 0xc) {
                stbi__get8(s);
              }
              pal[uVar41][3] = 0xff;
            }
            stbi__skip(s,(uVar23 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                         (iStack_88f0 + local_88d8));
            if (asVar21 == (stbi_uc  [4])0x1) {
              sVar19 = s->img_x;
              iVar20 = 0;
              uVar23 = 0;
LAB_00159d1f:
              uVar41 = (ulong)uVar23;
              sVar17 = s->img_y;
              if (iVar20 < (int)sVar17) {
                iVar40 = 0;
                do {
                  bVar15 = stbi__get8(s);
                  sVar17 = s->img_x;
                  iVar44 = 8;
                  do {
                    uVar23 = (uint)uVar41;
                    if ((int)sVar17 <= iVar40) {
LAB_00159dbc:
                      stbi__skip(s,-(sVar19 + 7 >> 3) & 3);
                      iVar20 = iVar20 + 1;
                      goto LAB_00159d1f;
                    }
                    bVar57 = (bVar15 >> (iVar44 - 1U & 0x1f) & 1) != 0;
                    lVar37 = (long)(int)uVar23;
                    uVar41 = lVar37 + 3;
                    *(stbi_uc *)((long)local_8980 + lVar37) = pal[bVar57][0];
                    *(stbi_uc *)((long)local_8980 + lVar37 + 1) = pal[bVar57][1];
                    *(stbi_uc *)((long)local_8980 + lVar37 + 2) = pal[bVar57][2];
                    if (iVar16 == 4) {
                      *(uchar *)((long)local_8980 + lVar37 + 3) = 0xff;
                      uVar41 = (ulong)(uVar23 + 4);
                    }
                    if (sVar17 - 1 == iVar40) {
                      uVar23 = (uint)uVar41;
                      goto LAB_00159dbc;
                    }
                    iVar40 = iVar40 + 1;
                    iVar48 = iVar44 + -1;
                    bVar57 = 0 < iVar44;
                    iVar44 = iVar48;
                  } while (iVar48 != 0 && bVar57);
                } while( true );
              }
              local_8950 = 0xff;
              uStack_88dc = local_8950;
              goto LAB_00159aa1;
            }
            if (asVar21 == (stbi_uc  [4])0x8) {
              uVar23 = s->img_x;
            }
            else {
              if (asVar21 != (stbi_uc  [4])0x4) goto LAB_0015977b;
              uVar23 = s->img_x + 1 >> 1;
            }
            uVar41 = 0;
            for (iVar20 = 0; sVar17 = s->img_y, iVar20 < (int)sVar17; iVar20 = iVar20 + 1) {
              for (iVar40 = 0; iVar40 < (int)s->img_x; iVar40 = iVar40 + 2) {
                bVar15 = stbi__get8(s);
                uVar26 = bVar15 & 0xf;
                uVar24 = (uint)(bVar15 >> 4);
                if (asVar21 != (stbi_uc  [4])0x4) {
                  uVar24 = (uint)bVar15;
                }
                if (asVar21 != (stbi_uc  [4])0x4) {
                  uVar26 = 0;
                }
                lVar37 = (long)(int)uVar41;
                uVar52 = lVar37 + 3;
                *(stbi_uc *)((long)local_8980 + lVar37) = pal[uVar24][0];
                *(stbi_uc *)((long)local_8980 + lVar37 + 1) = pal[uVar24][1];
                *(stbi_uc *)((long)local_8980 + lVar37 + 2) = pal[uVar24][2];
                if (iVar16 == 4) {
                  *(uchar *)((long)local_8980 + lVar37 + 3) = 0xff;
                  uVar52 = (ulong)((int)uVar41 + 4);
                }
                if (iVar40 + 1U == s->img_x) {
                  uVar41 = uVar52 & 0xffffffff;
                  break;
                }
                if (asVar21 == (stbi_uc  [4])0x8) {
                  bVar15 = stbi__get8(s);
                  uVar26 = (uint)bVar15;
                }
                lVar37 = (long)(int)uVar52;
                uVar41 = lVar37 + 3;
                *(stbi_uc *)((long)local_8980 + lVar37) = pal[uVar26][0];
                *(stbi_uc *)((long)local_8980 + lVar37 + 1) = pal[uVar26][1];
                *(stbi_uc *)((long)local_8980 + lVar37 + 2) = pal[uVar26][2];
                if (iVar16 == 4) {
                  *(uchar *)((long)local_8980 + lVar37 + 3) = 0xff;
                  uVar41 = (ulong)((int)uVar52 + 4);
                }
              }
              stbi__skip(s,-uVar23 & 3);
            }
            goto LAB_00159aa1;
          }
        }
        else {
          stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
          if (asVar21 != (stbi_uc  [4])0x10) {
            if (asVar21 == (stbi_uc  [4])0x20) {
              local_88fc = 0;
              if (!(bool)(bVar8 & (uStack_88ec == 0xff0000 &&
                                  (local_88e8 == 0xff00 && uStack_88e4 == 0xff))))
              goto LAB_001596a6;
              bVar57 = true;
            }
            else {
              local_88fc = 0;
              if (asVar21 != (stbi_uc  [4])0x18) goto LAB_001596a6;
              local_88fc = s->img_x & 3;
              bVar57 = false;
            }
            bVar8 = false;
            iVar48 = 0;
            iVar20 = 0;
            iVar40 = 0;
            iVar44 = 0;
            uVar23 = 0;
            local_890c = 0;
            local_88bc = 0;
            local_88c8 = 0;
LAB_001598c2:
            local_8988._0_4_ = 0;
            for (iVar39 = 0; sVar17 = s->img_y, iVar39 < (int)sVar17; iVar39 = iVar39 + 1) {
              if (bVar8) {
                for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 1) {
                  if (asVar21 == (stbi_uc  [4])0x10) {
                    uVar24 = stbi__get16le(s);
                  }
                  else {
                    uVar24 = stbi__get32le(s);
                  }
                  iVar25 = stbi__shiftsigned(uVar24 & uStack_88ec,iVar48,uVar23);
                  lVar37 = (long)(int)local_8988;
                  *(uchar *)((long)local_8980 + lVar37) = (uchar)iVar25;
                  iVar25 = stbi__shiftsigned(uVar24 & local_88e8,iVar20,local_890c);
                  *(uchar *)((long)local_8980 + lVar37 + 1) = (uchar)iVar25;
                  iVar25 = stbi__shiftsigned(uVar24 & uStack_88e4,iVar40,local_88bc);
                  *(uchar *)((long)local_8980 + lVar37 + 2) = (uchar)iVar25;
                  if (uStack_88e0 == 0) {
                    uVar24 = 0xff;
                  }
                  else {
                    uVar24 = stbi__shiftsigned(uVar24 & uStack_88e0,iVar44,local_88c8);
                  }
                  iVar25 = (int)local_8988 + 3;
                  if (iVar16 == 4) {
                    *(uchar *)((long)local_8980 + lVar37 + 3) = (uchar)uVar24;
                    iVar25 = (int)local_8988 + 4;
                  }
                  local_8988._0_4_ = iVar25;
                  uStack_88dc = uStack_88dc | uVar24;
                }
              }
              else {
                for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 1) {
                  sVar9 = stbi__get8(s);
                  lVar37 = (long)(int)local_8988;
                  *(stbi_uc *)((long)local_8980 + lVar37 + 2) = sVar9;
                  sVar9 = stbi__get8(s);
                  *(stbi_uc *)((long)local_8980 + lVar37 + 1) = sVar9;
                  sVar9 = stbi__get8(s);
                  *(stbi_uc *)((long)local_8980 + lVar37) = sVar9;
                  bVar15 = 0xff;
                  if (bVar57) {
                    bVar15 = stbi__get8(s);
                  }
                  iVar25 = (int)local_8988 + 3;
                  if (iVar16 == 4) {
                    *(byte *)((long)local_8980 + lVar37 + 3) = bVar15;
                    iVar25 = (int)local_8988 + 4;
                  }
                  local_8988._0_4_ = iVar25;
                  uStack_88dc = uStack_88dc | bVar15;
                }
              }
              stbi__skip(s,local_88fc);
            }
LAB_00159aa1:
            if ((iVar16 == 4) && (uStack_88dc == 0)) {
              for (uVar23 = s->img_x * sVar17 * 4 - 1; -1 < (int)uVar23; uVar23 = uVar23 - 4) {
                *(uchar *)((long)local_8980 + (ulong)uVar23) = 0xff;
              }
            }
            if (0 < (int)uVar18) {
              iVar20 = (int)sVar17 >> 1;
              if ((int)sVar17 >> 1 < 1) {
                iVar20 = 0;
              }
              iVar40 = (sVar17 - 1) * iVar16;
              iVar48 = 0;
              for (iVar44 = 0; iVar44 != iVar20; iVar44 = iVar44 + 1) {
                sVar19 = s->img_x;
                uVar41 = (ulong)(sVar19 * iVar16);
                if ((int)(sVar19 * iVar16) < 1) {
                  uVar41 = 0;
                }
                for (uVar52 = 0; uVar41 != uVar52; uVar52 = uVar52 + 1) {
                  uVar2 = *(uchar *)((long)local_8980 + uVar52 + sVar19 * iVar48);
                  *(uchar *)((long)local_8980 + uVar52 + sVar19 * iVar48) =
                       *(uchar *)((long)local_8980 + uVar52 + sVar19 * iVar40);
                  *(uchar *)((long)local_8980 + uVar52 + sVar19 * iVar40) = uVar2;
                }
                iVar40 = iVar40 - iVar16;
                iVar48 = iVar48 + iVar16;
              }
            }
            uVar18 = s->img_x;
            if ((req_comp != 0) && (iVar16 != req_comp)) {
              local_8980 = (stbi__jpeg *)
                           stbi__convert_format((uchar *)local_8980,iVar16,req_comp,uVar18,sVar17);
              if (local_8980 == (stbi__jpeg *)0x0) {
                return (void *)0x0;
              }
              uVar18 = s->img_x;
            }
            *x = uVar18;
            *y = s->img_y;
            if (comp != (int *)0x0) {
              *comp = s->img_n;
              return (uchar *)local_8980;
            }
            return (uchar *)local_8980;
          }
          local_88fc = s->img_x * 2 & 2;
LAB_001596a6:
          if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
            iVar48 = stbi__high_bit(uStack_88ec);
            uVar23 = stbi__bitcount(uStack_88ec);
            iVar20 = stbi__high_bit(local_88e8);
            local_890c = stbi__bitcount(local_88e8);
            iVar40 = stbi__high_bit(uStack_88e4);
            local_88bc = stbi__bitcount(uStack_88e4);
            iVar44 = stbi__high_bit(uStack_88e0);
            local_88c8 = stbi__bitcount(uStack_88e0);
            if ((local_88bc < 9 && (local_890c < 9 && uVar23 < 9)) && local_88c8 < 9) {
              iVar48 = iVar48 + -7;
              iVar20 = iVar20 + -7;
              iVar40 = iVar40 + -7;
              iVar44 = iVar44 + -7;
              bVar8 = true;
              bVar57 = false;
              goto LAB_001598c2;
            }
          }
        }
LAB_0015977b:
        free(local_8980);
        goto LAB_00159785;
      }
      goto LAB_0015942e;
    }
LAB_00158550:
    pcVar27 = "Very large image (corrupt?)";
    goto LAB_001579e1;
  }
LAB_00157b64:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar16 = stbi__gif_test(s);
  if (iVar16 != 0) {
    memset((stbi__gif *)pal,0,0x8870);
    psVar29 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)pal,comp,0,psVar56);
    if (psVar29 == (stbi__context *)0x0 || psVar29 == s) {
      free((void *)pal._8_8_);
      psVar29 = (stbi__context *)0x0;
    }
    else {
      *x = (int)pal[0];
      *y = (int)pal[1];
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar29 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar29,4,req_comp,(uint)pal[0],(uint)pal[1]);
      }
    }
    free((void *)pal._24_8_);
    local_8980 = (stbi__jpeg *)pal._16_8_;
    goto LAB_00157dc2;
  }
  sVar17 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar17 == 0x38425053) {
    sVar17 = stbi__get32be(s);
    if (sVar17 != 0x38425053) {
      pcVar27 = "Corrupt PSD image";
      goto LAB_001579e1;
    }
    iVar16 = stbi__get16be(s);
    if (iVar16 != 1) {
      pcVar27 = "Unsupported version of PSD image";
      goto LAB_001579e1;
    }
    stbi__skip(s,6);
    uVar18 = stbi__get16be(s);
    if (0x10 < uVar18) {
      pcVar27 = "Unsupported number of channels in PSD image";
      goto LAB_001579e1;
    }
    sVar17 = stbi__get32be(s);
    sVar19 = stbi__get32be(s);
    if ((0x1000000 < (int)sVar17) || (0x1000000 < (int)sVar19)) goto LAB_00158550;
    iVar16 = stbi__get16be(s);
    if ((iVar16 != 8) && (iVar16 != 0x10)) {
      pcVar27 = "PSD bit depth is not 8 or 16 bit";
      goto LAB_001579e1;
    }
    iVar20 = stbi__get16be(s);
    if (iVar20 != 3) {
      pcVar27 = "PSD is not in RGB color format";
      goto LAB_001579e1;
    }
    sVar22 = stbi__get32be(s);
    stbi__skip(s,sVar22);
    sVar22 = stbi__get32be(s);
    stbi__skip(s,sVar22);
    sVar22 = stbi__get32be(s);
    stbi__skip(s,sVar22);
    uVar23 = stbi__get16be(s);
    if (1 < uVar23) {
      pcVar27 = "PSD has an unknown compression format";
      goto LAB_001579e1;
    }
    iVar20 = stbi__mad3sizes_valid(4,sVar19,sVar17,0);
    if (iVar20 == 0) {
      pcVar27 = "Corrupt PSD";
      goto LAB_001579e1;
    }
    if (((bpc == 0x10) && (iVar16 == 0x10)) && (uVar23 == 0)) {
      local_8980 = (stbi__jpeg *)stbi__malloc_mad3(8,sVar19,sVar17,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      local_8980 = (stbi__jpeg *)malloc((long)(int)(sVar17 * sVar19 * 4));
    }
    if (local_8980 != (stbi__jpeg *)0x0) {
      uVar24 = sVar19 * sVar17;
      if (uVar23 == 0) {
        uVar41 = 0;
        psVar31 = (stbi__uint16 *)local_8980;
        local_8988 = (stbi__uint16 *)local_8980;
        uVar23 = 0;
        if (0 < (int)uVar24) {
          uVar23 = uVar24;
        }
        for (; uVar41 != 4; uVar41 = uVar41 + 1) {
          if (uVar41 < uVar18) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar37 = 0; uVar23 != (uint)lVar37; lVar37 = lVar37 + 1) {
                iVar20 = stbi__get16be(s);
                local_8988[lVar37 * 4] = (stbi__uint16)iVar20;
              }
            }
            else {
              lVar37 = 0;
              if (iVar16 == 0x10) {
                for (; uVar23 != (uint)lVar37; lVar37 = lVar37 + 1) {
                  iVar20 = stbi__get16be(s);
                  *(char *)(psVar31 + lVar37 * 2) = (char)((uint)iVar20 >> 8);
                }
              }
              else {
                for (; uVar23 != (uint)lVar37; lVar37 = lVar37 + 1) {
                  sVar9 = stbi__get8(s);
                  *(stbi_uc *)(psVar31 + lVar37 * 2) = sVar9;
                }
              }
            }
          }
          else if (iVar16 == 0x10 && bpc == 0x10) {
            for (lVar37 = 0; uVar23 != (uint)lVar37; lVar37 = lVar37 + 1) {
              local_8988[lVar37 * 4] = -(ushort)(uVar41 == 3);
            }
          }
          else {
            for (lVar37 = 0; uVar23 != (uint)lVar37; lVar37 = lVar37 + 1) {
              *(char *)(psVar31 + lVar37 * 2) = -(uVar41 == 3);
            }
          }
          psVar31 = (stbi__uint16 *)((long)psVar31 + 1);
          local_8988 = local_8988 + 1;
        }
      }
      else {
        stbi__skip(s,sVar17 * uVar18 * 2);
        uVar41 = 0;
        psVar31 = (stbi__uint16 *)local_8980;
        uVar23 = 0;
        if (0 < (int)uVar24) {
          uVar23 = uVar24;
        }
        for (; uVar41 != 4; uVar41 = uVar41 + 1) {
          if (uVar41 < uVar18) {
            psVar56 = (stbi_uc *)((long)local_8980 + uVar41);
            iVar16 = 0;
            do {
              uVar26 = uVar24 - iVar16;
              do {
                if ((int)uVar26 < 1) goto LAB_00159fbb;
                bVar15 = stbi__get8(s);
              } while (bVar15 == 0x80);
              uVar49 = (uint)bVar15;
              if ((char)bVar15 < '\0') {
                uVar50 = 0x101 - uVar49;
                if (uVar26 < uVar50) goto LAB_0015a60b;
                sVar9 = stbi__get8(s);
                for (iVar20 = uVar49 - 0x101; iVar20 != 0; iVar20 = iVar20 + 1) {
                  *psVar56 = sVar9;
                  psVar56 = psVar56 + 4;
                }
              }
              else {
                if (uVar26 <= bVar15) {
LAB_0015a60b:
                  free(local_8980);
                  pcVar27 = "bad RLE data";
                  goto LAB_001579e1;
                }
                uVar50 = uVar49 + 1;
                uVar26 = uVar50;
                while (bVar57 = uVar26 != 0, uVar26 = uVar26 - 1, bVar57) {
                  sVar9 = stbi__get8(s);
                  *psVar56 = sVar9;
                  psVar56 = psVar56 + 4;
                }
              }
              iVar16 = iVar16 + uVar50;
            } while( true );
          }
          for (lVar37 = 0; uVar23 != (uint)lVar37; lVar37 = lVar37 + 1) {
            *(char *)(psVar31 + lVar37 * 2) = -(uVar41 == 3);
          }
LAB_00159fbb:
          psVar31 = (stbi__uint16 *)((long)psVar31 + 1);
        }
      }
      if (3 < uVar18) {
        uVar41 = 0;
        if (0 < (int)uVar24) {
          uVar41 = (ulong)uVar24;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar52 = 0; uVar41 != uVar52; uVar52 = uVar52 + 1) {
            uVar5 = *(ushort *)((long)local_8980 + (uVar52 * 4 + 3) * 2);
            if ((uVar5 != 0) && (uVar5 != 0xffff)) {
              fVar59 = 1.0 / ((float)uVar5 / 65535.0);
              fVar58 = (1.0 - fVar59) * 65535.0;
              auVar60._0_4_ =
                   (int)(fVar58 + fVar59 * (float)(*(uint *)((long)local_8980 + uVar52 * 4 * 2) &
                                                  0xffff));
              auVar60._4_4_ =
                   (int)(fVar58 + fVar59 * (float)(*(uint *)((long)local_8980 + uVar52 * 4 * 2) >>
                                                  0x10));
              auVar60._8_4_ = (int)(fVar58 + fVar59 * 0.0);
              auVar60._12_4_ = (int)(fVar58 + fVar59 * 0.0);
              auVar60 = pshuflw(auVar60,auVar60,0xe8);
              *(int *)((long)local_8980 + uVar52 * 4 * 2) = auVar60._0_4_;
              *(stbi__uint16 *)((long)local_8980 + (uVar52 * 4 + 2) * 2) =
                   (stbi__uint16)
                   (int)((float)*(ushort *)((long)local_8980 + (uVar52 * 4 + 2) * 2) * fVar59 +
                        fVar58);
            }
          }
        }
        else {
          for (uVar52 = 0; uVar41 != uVar52; uVar52 = uVar52 + 1) {
            bVar15 = *(byte *)((long)local_8980 + uVar52 * 4 + 3);
            if ((bVar15 != 0) && (bVar15 != 0xff)) {
              fVar59 = 1.0 / ((float)bVar15 / 255.0);
              fVar58 = (1.0 - fVar59) * 255.0;
              *(char *)((long)local_8980 + uVar52 * 2 * 2) =
                   (char)(int)((float)(byte)*(stbi__uint16 *)((long)local_8980 + uVar52 * 2 * 2) *
                               fVar59 + fVar58);
              *(char *)((long)local_8980 + uVar52 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)local_8980 + uVar52 * 4 + 1) * fVar59 + fVar58
                              );
              *(char *)((long)local_8980 + (uVar52 * 2 + 1) * 2) =
                   (char)(int)((float)(byte)*(stbi__uint16 *)
                                             ((long)local_8980 + (uVar52 * 2 + 1) * 2) * fVar59 +
                              fVar58);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          local_8980 = (stbi__jpeg *)
                       stbi__convert_format16((stbi__uint16 *)local_8980,4,req_comp,sVar19,sVar17);
        }
        else {
          local_8980 = (stbi__jpeg *)
                       stbi__convert_format((uchar *)local_8980,4,req_comp,sVar19,sVar17);
        }
        if (local_8980 == (stbi__jpeg *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar17;
      *x = sVar19;
      return (stbi__uint16 *)local_8980;
    }
  }
  else {
    iVar16 = stbi__pic_is4(s,anon_var_dwarf_1dabdf);
    iVar20 = (int)psVar56;
    if (iVar16 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar16 = 0x54;
      while( true ) {
        iVar20 = (int)psVar56;
        bVar57 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar57) break;
        stbi__get8(s);
      }
      iVar16 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar16 != 0) {
        iVar16 = 0x5c;
        while (bVar57 = iVar16 != 0, iVar16 = iVar16 + -1, bVar57) {
          stbi__get8(s);
        }
        uVar18 = stbi__get16be(s);
        uVar23 = stbi__get16be(s);
        iVar16 = stbi__at_eof(s);
        if (iVar16 != 0) {
          pcVar27 = "file too short (pic header)";
          goto LAB_001579e1;
        }
        iVar16 = stbi__mad3sizes_valid(uVar18,uVar23,4,0);
        if (iVar16 == 0) {
          pcVar27 = "PIC image too large to decode";
          goto LAB_001579e1;
        }
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        local_8980 = (stbi__jpeg *)stbi__malloc_mad3(uVar18,uVar23,4,0);
        if (local_8980 != (stbi__jpeg *)0x0) {
          memset(local_8980,0xff,(ulong)(uVar18 * 4 * uVar23));
          psVar56 = pal[0] + 2;
          lVar37 = 0;
          uVar24 = uVar23;
          uVar26 = 0;
          while( true ) {
            if (lVar37 == 10) {
              *(char **)(in_FS_OFFSET + -0x20) = "too many packets";
              goto LAB_00159dfe;
            }
            sVar9 = stbi__get8(s);
            bVar15 = stbi__get8(s);
            (*(stbi_uc (*) [4])(psVar56 + -2))[0] = bVar15;
            bVar11 = stbi__get8(s);
            psVar56[-1] = bVar11;
            bVar11 = stbi__get8(s);
            *psVar56 = bVar11;
            iVar16 = stbi__at_eof(s);
            uVar24 = uVar26;
            if (iVar16 != 0) break;
            if (bVar15 != 8) {
              pcVar27 = "packet isn\'t 8bpp";
              goto LAB_0015952a;
            }
            uVar26 = uVar26 | bVar11;
            psVar56 = psVar56 + 3;
            lVar37 = lVar37 + 1;
            if (sVar9 == '\0') goto code_r0x001582b8;
          }
          pcVar27 = "file too short (reading packets)";
LAB_0015952a:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar27;
LAB_00159dfe:
          free(local_8980);
          local_8980 = (stbi__jpeg *)0x0;
          goto LAB_00159e24;
        }
        goto LAB_0015942e;
      }
    }
    psVar30 = (stbi__jpeg *)calloc(1,0x4888);
    if (psVar30 == (stbi__jpeg *)0x0) {
      *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
    }
    else {
      psVar30->s = s;
      psVar30->idct_block_kernel = stbi__idct_simd;
      psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      iVar16 = stbi__decode_jpeg_header(psVar30,1);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar30);
      if (iVar16 != 0) {
        local_8980 = (stbi__jpeg *)calloc(1,0x4888);
        if (local_8980 != (stbi__jpeg *)0x0) {
          local_8980->s = s;
          local_8980->idct_block_kernel = stbi__idct_simd;
          local_8980->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
          local_8980->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
          s->img_n = 0;
          if ((uint)req_comp < 5) {
            for (lVar37 = 0x46d8; lVar37 != 0x4858; lVar37 = lVar37 + 0x60) {
              psVar56 = local_8980->huff_dc[0].fast + lVar37 + -8;
              psVar56[0] = '\0';
              psVar56[1] = '\0';
              psVar56[2] = '\0';
              psVar56[3] = '\0';
              psVar56[4] = '\0';
              psVar56[5] = '\0';
              psVar56[6] = '\0';
              psVar56[7] = '\0';
              psVar56[8] = '\0';
              psVar56[9] = '\0';
              psVar56[10] = '\0';
              psVar56[0xb] = '\0';
              psVar56[0xc] = '\0';
              psVar56[0xd] = '\0';
              psVar56[0xe] = '\0';
              psVar56[0xf] = '\0';
            }
            local_8980->restart_interval = 0;
            iVar16 = stbi__decode_jpeg_header(local_8980,0);
            if (iVar16 != 0) {
              paVar1 = local_8980->img_comp;
              bVar15 = stbi__get_marker(local_8980);
LAB_001587d3:
              if (bVar15 == 0xda) {
                iVar16 = stbi__get16be(local_8980->s);
                bVar15 = stbi__get8(local_8980->s);
                uVar18 = (uint)bVar15;
                local_8980->scan_n = (uint)bVar15;
                if ((((byte)(bVar15 - 5) < 0xfc) ||
                    (psVar29 = local_8980->s, psVar29->img_n < (int)(uint)bVar15)) ||
                   (iVar16 != (uint)bVar15 * 2 + 6)) {
LAB_0015a24a:
                  pcVar27 = "Corrupt JPEG";
LAB_0015a251:
                  *(char **)(in_FS_OFFSET + -0x20) = pcVar27;
                  goto LAB_0015a25a;
                }
                lVar37 = 0;
                while( true ) {
                  bVar15 = stbi__get8(psVar29);
                  if ((int)uVar18 <= lVar37) break;
                  bVar11 = stbi__get8(local_8980->s);
                  psVar29 = local_8980->s;
                  uVar18 = psVar29->img_n;
                  uVar41 = 0;
                  if (0 < (int)uVar18) {
                    uVar41 = (ulong)uVar18;
                  }
                  paVar46 = paVar1;
                  for (uVar52 = 0; uVar41 != uVar52; uVar52 = uVar52 + 1) {
                    if (paVar46->id == (uint)bVar15) {
                      uVar41 = uVar52 & 0xffffffff;
                      break;
                    }
                    paVar46 = paVar46 + 1;
                  }
                  if ((uint)uVar41 == uVar18) goto LAB_0015a25a;
                  local_8980->img_comp[uVar41].hd = (uint)(bVar11 >> 4);
                  if ((0x3f < bVar11) || (paVar1[uVar41].ha = bVar11 & 0xf, 3 < (bVar11 & 0xf)))
                  goto LAB_0015a24a;
                  local_8980->order[lVar37] = (uint)uVar41;
                  lVar37 = lVar37 + 1;
                  uVar18 = local_8980->scan_n;
                }
                local_8980->spec_start = (uint)bVar15;
                bVar15 = stbi__get8(local_8980->s);
                local_8980->spec_end = (uint)bVar15;
                bVar15 = stbi__get8(local_8980->s);
                local_8980->succ_high = (uint)(bVar15 >> 4);
                local_8980->succ_low = bVar15 & 0xf;
                iVar16 = local_8980->spec_start;
                if (local_8980->progressive != 0) {
                  if (((iVar16 < 0x40) && (local_8980->spec_end < 0x40)) &&
                     ((iVar16 <= local_8980->spec_end && ((bVar15 < 0xe0 && ((bVar15 & 0xf) < 0xe)))
                      ))) goto LAB_001589d1;
                  goto LAB_0015a24a;
                }
                if ((iVar16 != 0) || ((0xf < bVar15 || ((bVar15 & 0xf) != 0)))) goto LAB_0015a24a;
                local_8980->spec_end = 0x3f;
LAB_001589d1:
                stbi__jpeg_reset(local_8980);
                if (local_8980->progressive != 0) {
                  if (local_8980->scan_n == 1) {
                    iVar16 = local_8980->order[0];
                    iVar40 = local_8980->img_comp[iVar16].x + 7 >> 3;
                    iVar20 = local_8980->img_comp[iVar16].y + 7 >> 3;
                    iVar44 = 0;
                    if (iVar40 < 1) {
                      iVar40 = 0;
                    }
                    if (iVar20 < 1) {
                      iVar20 = iVar44;
                    }
                    for (; iVar44 != iVar20; iVar44 = iVar44 + 1) {
                      for (iVar48 = 0; iVar48 != iVar40; iVar48 = iVar48 + 1) {
                        psVar55 = paVar1[iVar16].coeff +
                                  (paVar1[iVar16].coeff_w * iVar44 + iVar48) * 0x40;
                        uVar41 = (ulong)local_8980->spec_start;
                        if (uVar41 == 0) {
                          iVar39 = stbi__jpeg_decode_block_prog_dc
                                             (local_8980,psVar55,
                                              (stbi__huffman *)
                                              local_8980->huff_dc[paVar1[iVar16].hd].fast,iVar16);
                          if (iVar39 == 0) goto LAB_0015a25a;
                        }
                        else {
                          iVar39 = paVar1[iVar16].ha;
                          psVar56 = local_8980->huff_ac[iVar39].fast;
                          iVar51 = local_8980->eob_run;
                          bVar15 = (byte)local_8980->succ_low;
                          if (local_8980->succ_high == 0) {
                            if (iVar51 == 0) {
                              do {
                                if (local_8980->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(local_8980);
                                }
                                sVar38 = local_8980->fast_ac[iVar39]
                                         [local_8980->code_buffer >> 0x17];
                                uVar18 = (uint)sVar38;
                                iVar51 = (int)uVar41;
                                if (sVar38 == 0) {
                                  uVar18 = stbi__jpeg_huff_decode
                                                     (local_8980,(stbi__huffman *)psVar56);
                                  if ((int)uVar18 < 0) goto LAB_0015a24a;
                                  uVar23 = uVar18 >> 4;
                                  if ((uVar18 & 0xf) == 0) {
                                    if (uVar18 < 0xf0) {
                                      iVar51 = 1 << ((byte)uVar23 & 0x1f);
                                      local_8980->eob_run = iVar51;
                                      if (0xf < uVar18) {
                                        iVar51 = stbi__jpeg_get_bits(local_8980,uVar23);
                                        iVar51 = iVar51 + local_8980->eob_run;
                                      }
                                      goto LAB_00158b7e;
                                    }
                                    uVar41 = (ulong)(iVar51 + 0x10);
                                  }
                                  else {
                                    lVar37 = (ulong)uVar23 + (long)iVar51;
                                    uVar41 = (ulong)((int)lVar37 + 1);
                                    bVar11 = ""[lVar37];
                                    iVar51 = stbi__extend_receive(local_8980,uVar18 & 0xf);
                                    psVar55[bVar11] = (short)(iVar51 << (bVar15 & 0x1f));
                                  }
                                }
                                else {
                                  uVar23 = uVar18 & 0xf;
                                  if (local_8980->code_bits < (int)uVar23) {
                                    pcVar27 = "Combined length longer than code bits available";
                                    goto LAB_0015a251;
                                  }
                                  lVar37 = (ulong)(uVar18 >> 4 & 0xf) + (long)iVar51;
                                  local_8980->code_buffer = local_8980->code_buffer << (sbyte)uVar23
                                  ;
                                  local_8980->code_bits = local_8980->code_bits - uVar23;
                                  uVar41 = (ulong)((int)lVar37 + 1);
                                  psVar55[""[lVar37]] = (short)((uVar18 >> 8) << (bVar15 & 0x1f));
                                }
                              } while ((int)uVar41 <= local_8980->spec_end);
                            }
                            else {
LAB_00158b7e:
                              local_8980->eob_run = iVar51 + -1;
                            }
                          }
                          else if (iVar51 == 0) {
                            iVar39 = 0x10000 << (bVar15 & 0x1f);
                            do {
                              uVar18 = stbi__jpeg_huff_decode(local_8980,(stbi__huffman *)psVar56);
                              if ((int)uVar18 < 0) goto LAB_0015a24a;
                              uVar23 = uVar18 >> 4;
                              if ((uVar18 & 0xf) == 1) {
                                iVar51 = stbi__jpeg_get_bit(local_8980);
                                iVar25 = 1;
                                if (iVar51 == 0) {
                                  iVar25 = 0xffff;
                                }
                                sVar38 = (short)(iVar25 << (bVar15 & 0x1f));
                              }
                              else {
                                if ((uVar18 & 0xf) != 0) goto LAB_0015a24a;
                                if (uVar18 < 0xf0) {
                                  local_8980->eob_run = ~(-1 << ((byte)uVar23 & 0x1f));
                                  if (0xf < uVar18) {
                                    iVar51 = stbi__jpeg_get_bits(local_8980,uVar23);
                                    local_8980->eob_run = local_8980->eob_run + iVar51;
                                  }
                                  uVar23 = 0x40;
                                }
                                else {
                                  uVar23 = 0xf;
                                }
                                sVar38 = 0;
                              }
                              uVar52 = (long)(int)uVar41;
                              do {
                                while( true ) {
                                  uVar41 = uVar52;
                                  iVar51 = local_8980->spec_end;
                                  if ((long)iVar51 < (long)uVar41) goto LAB_00158cad;
                                  bVar11 = ""[uVar41];
                                  if (psVar55[bVar11] == 0) break;
                                  iVar51 = stbi__jpeg_get_bit(local_8980);
                                  if ((iVar51 != 0) &&
                                     (sVar4 = psVar55[bVar11], (iVar39 >> 0x10 & (int)sVar4) == 0))
                                  {
                                    sVar7 = (short)((uint)iVar39 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar7 = -sVar7;
                                    }
                                    psVar55[bVar11] = sVar4 + sVar7;
                                  }
                                  uVar52 = uVar41 + 1;
                                }
                                bVar57 = uVar23 != 0;
                                uVar23 = uVar23 - 1;
                                uVar52 = uVar41 + 1;
                              } while (bVar57);
                              psVar55[bVar11] = sVar38;
                              uVar41 = uVar41 + 1;
LAB_00158cad:
                            } while ((int)uVar41 <= iVar51);
                          }
                          else {
                            local_8980->eob_run = iVar51 + -1;
                            uVar18 = (0x10000 << (bVar15 & 0x1f)) >> 0x10;
                            for (; (long)uVar41 <= (long)local_8980->spec_end; uVar41 = uVar41 + 1)
                            {
                              bVar15 = ""[uVar41];
                              if (((psVar55[bVar15] != 0) &&
                                  (iVar39 = stbi__jpeg_get_bit(local_8980), iVar39 != 0)) &&
                                 (sVar38 = psVar55[bVar15], (uVar18 & (int)sVar38) == 0)) {
                                uVar23 = -uVar18;
                                if (0 < sVar38) {
                                  uVar23 = uVar18;
                                }
                                psVar55[bVar15] = (short)uVar23 + sVar38;
                              }
                            }
                          }
                        }
                        iVar39 = local_8980->todo;
                        local_8980->todo = iVar39 + -1;
                        if (iVar39 < 2) {
                          if (local_8980->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(local_8980);
                          }
                          bVar15 = local_8980->marker;
                          if ((bVar15 & 0xf8) != 0xd0) goto LAB_00159290;
                          stbi__jpeg_reset(local_8980);
                        }
                      }
                    }
                  }
                  else {
                    for (iVar16 = 0; iVar16 < local_8980->img_mcu_y; iVar16 = iVar16 + 1) {
                      for (iVar20 = 0; iVar20 < local_8980->img_mcu_x; iVar20 = iVar20 + 1) {
                        for (lVar37 = 0; lVar37 < local_8980->scan_n; lVar37 = lVar37 + 1) {
                          iVar40 = local_8980->order[lVar37];
                          for (iVar44 = 0; iVar44 < paVar1[iVar40].v; iVar44 = iVar44 + 1) {
                            iVar48 = 0;
                            while (iVar48 < paVar1[iVar40].h) {
                              iVar39 = stbi__jpeg_decode_block_prog_dc
                                                 (local_8980,
                                                  paVar1[iVar40].coeff +
                                                  (paVar1[iVar40].h * iVar20 + iVar48 +
                                                  (paVar1[iVar40].v * iVar16 + iVar44) *
                                                  paVar1[iVar40].coeff_w) * 0x40,
                                                  (stbi__huffman *)
                                                  local_8980->huff_dc[paVar1[iVar40].hd].fast,iVar40
                                                 );
                              iVar48 = iVar48 + 1;
                              if (iVar39 == 0) goto LAB_0015a25a;
                            }
                          }
                        }
                        iVar40 = local_8980->todo;
                        local_8980->todo = iVar40 + -1;
                        if (iVar40 < 2) {
                          if (local_8980->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(local_8980);
                          }
                          bVar15 = local_8980->marker;
                          if ((bVar15 & 0xf8) != 0xd0) goto LAB_00159290;
                          stbi__jpeg_reset(local_8980);
                        }
                      }
                    }
                  }
                  goto LAB_00159289;
                }
                if (local_8980->scan_n == 1) {
                  iVar16 = local_8980->order[0];
                  uVar18 = local_8980->img_comp[iVar16].x + 7 >> 3;
                  iVar20 = local_8980->img_comp[iVar16].y + 7 >> 3;
                  if ((int)uVar18 < 1) {
                    uVar18 = 0;
                  }
                  iVar40 = 0;
                  if (iVar20 < 1) {
                    iVar20 = 0;
                  }
                  for (iVar44 = 0; iVar44 != iVar20; iVar44 = iVar44 + 1) {
                    for (lVar37 = 0; (ulong)uVar18 * 8 != lVar37; lVar37 = lVar37 + 8) {
                      iVar48 = stbi__jpeg_decode_block
                                         (local_8980,(short *)pal,
                                          (stbi__huffman *)
                                          local_8980->huff_dc[paVar1[iVar16].hd].fast,
                                          (stbi__huffman *)
                                          local_8980->huff_ac[paVar1[iVar16].ha].fast,
                                          local_8980->fast_ac[paVar1[iVar16].ha],iVar16,
                                          local_8980->dequant[paVar1[iVar16].tq]);
                      if (iVar48 == 0) {
                        bVar57 = false;
                        goto LAB_00159281;
                      }
                      (*local_8980->idct_block_kernel)
                                (paVar1[iVar16].data + lVar37 + iVar40 * paVar1[iVar16].w2,
                                 paVar1[iVar16].w2,(short *)pal);
                      iVar48 = local_8980->todo;
                      local_8980->todo = iVar48 + -1;
                      if (iVar48 < 2) {
                        if (local_8980->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(local_8980);
                        }
                        if ((local_8980->marker & 0xf8) != 0xd0) goto LAB_0015927e;
                        stbi__jpeg_reset(local_8980);
                      }
                    }
                    iVar40 = iVar40 + 8;
                  }
LAB_0015927e:
                  bVar57 = true;
                }
                else {
                  for (iVar16 = 0; iVar16 < local_8980->img_mcu_y; iVar16 = iVar16 + 1) {
                    for (iVar20 = 0; iVar20 < local_8980->img_mcu_x; iVar20 = iVar20 + 1) {
                      for (lVar37 = 0; lVar37 < local_8980->scan_n; lVar37 = lVar37 + 1) {
                        iVar40 = local_8980->order[lVar37];
                        for (iVar44 = 0; iVar44 < paVar1[iVar40].v; iVar44 = iVar44 + 1) {
                          for (iVar48 = 0; iVar39 = paVar1[iVar40].h, iVar48 < iVar39;
                              iVar48 = iVar48 + 1) {
                            iVar51 = paVar1[iVar40].v;
                            iVar25 = stbi__jpeg_decode_block
                                               (local_8980,(short *)pal,
                                                (stbi__huffman *)
                                                local_8980->huff_dc[paVar1[iVar40].hd].fast,
                                                (stbi__huffman *)
                                                local_8980->huff_ac[paVar1[iVar40].ha].fast,
                                                local_8980->fast_ac[paVar1[iVar40].ha],iVar40,
                                                local_8980->dequant[paVar1[iVar40].tq]);
                            if (iVar25 == 0) {
                              bVar57 = false;
                              goto LAB_00159281;
                            }
                            (*local_8980->idct_block_kernel)
                                      (paVar1[iVar40].data +
                                       (long)((iVar39 * iVar20 + iVar48) * 8) +
                                       (long)((iVar51 * iVar16 + iVar44) * paVar1[iVar40].w2 * 8),
                                       paVar1[iVar40].w2,(short *)pal);
                          }
                        }
                      }
                      iVar40 = local_8980->todo;
                      local_8980->todo = iVar40 + -1;
                      if (iVar40 < 2) {
                        if (local_8980->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(local_8980);
                        }
                        if ((local_8980->marker & 0xf8) != 0xd0) goto LAB_0015930b;
                        stbi__jpeg_reset(local_8980);
                      }
                    }
                  }
LAB_0015930b:
                  bVar57 = true;
                }
LAB_00159281:
                if (!bVar57) goto LAB_0015a25a;
LAB_00159289:
                bVar15 = local_8980->marker;
LAB_00159290:
                if (bVar15 == 0xff) {
                  while (iVar16 = stbi__at_eof(local_8980->s), iVar16 == 0) {
                    sVar9 = stbi__get8(local_8980->s);
                    while (sVar9 == 0xff) {
                      iVar16 = stbi__at_eof(local_8980->s);
                      if (iVar16 != 0) goto LAB_001592d8;
                      sVar9 = stbi__get8(local_8980->s);
                      if ((byte)(sVar9 - 1) < 0xfe) goto LAB_001592da;
                    }
                  }
LAB_001592d8:
                  sVar9 = 0xff;
LAB_001592da:
                  local_8980->marker = sVar9;
                }
                bVar15 = stbi__get_marker(local_8980);
                if ((bVar15 & 0xf8) != 0xd0) goto LAB_001587d3;
LAB_00158831:
                bVar15 = stbi__get_marker(local_8980);
                goto LAB_001587d3;
              }
              uVar18 = (uint)bVar15;
              if (uVar18 == 0xdc) {
                iVar16 = stbi__get16be(local_8980->s);
                sVar17 = stbi__get16be(local_8980->s);
                if ((iVar16 != 4) || (sVar17 != local_8980->s->img_y)) goto LAB_0015a24a;
                goto LAB_00158831;
              }
              if (uVar18 == 0xd9) {
                if (local_8980->progressive != 0) {
                  for (lVar37 = 0; lVar37 < local_8980->s->img_n; lVar37 = lVar37 + 1) {
                    uVar18 = local_8980->img_comp[lVar37].x + 7 >> 3;
                    iVar16 = local_8980->img_comp[lVar37].y + 7 >> 3;
                    uVar52 = 0;
                    uVar41 = (ulong)uVar18;
                    if ((int)uVar18 < 1) {
                      uVar41 = uVar52;
                    }
                    if (iVar16 < 1) {
                      iVar16 = 0;
                    }
                    while (iVar20 = (int)uVar52, iVar20 != iVar16) {
                      for (uVar52 = 0; uVar52 != uVar41; uVar52 = uVar52 + 1) {
                        psVar55 = paVar1[lVar37].coeff;
                        iVar44 = paVar1[lVar37].coeff_w * iVar20;
                        iVar40 = paVar1[lVar37].tq;
                        iVar48 = iVar44 + (int)uVar52;
                        for (lVar33 = 0; lVar33 != 0x40; lVar33 = lVar33 + 1) {
                          psVar55[iVar48 * 0x40 + lVar33] =
                               psVar55[iVar48 * 0x40 + lVar33] * local_8980->dequant[iVar40][lVar33]
                          ;
                        }
                        (*local_8980->idct_block_kernel)
                                  (paVar1[lVar37].data +
                                   uVar52 * 8 + (long)(iVar20 * 8 * paVar1[lVar37].w2),
                                   paVar1[lVar37].w2,psVar55 + (iVar44 + (int)uVar52) * 0x40);
                      }
                      uVar52 = (ulong)(iVar20 + 1);
                    }
                  }
                }
              }
              else {
                iVar16 = stbi__process_marker(local_8980,uVar18);
                if (iVar16 != 0) goto LAB_00158831;
              }
              psVar43 = local_8980->s;
              uVar18 = psVar43->img_n;
              uVar23 = (2 < (int)uVar18) + 1 + (uint)(2 < (int)uVar18);
              if (req_comp != 0) {
                uVar23 = req_comp;
              }
              if (uVar18 == 3) {
                bVar57 = true;
                if (local_8980->rgb != 3) {
                  if (local_8980->app14_color_transform == 0) {
                    bVar57 = local_8980->jfif == 0;
                  }
                  else {
                    bVar57 = false;
                  }
                }
              }
              else {
                bVar57 = false;
              }
              uVar24 = 1;
              if (bVar57) {
                uVar24 = uVar18;
              }
              if (2 < (int)uVar23) {
                uVar24 = uVar18;
              }
              if (uVar18 != 3) {
                uVar24 = uVar18;
              }
              if (0 < (int)uVar24) {
                _value = (stbi_uc *)0x0;
                sVar17 = psVar43->img_x;
                for (lVar37 = 0; (ulong)uVar24 * 0x30 != lVar37; lVar37 = lVar37 + 0x30) {
                  pvVar28 = malloc((ulong)(sVar17 + 3));
                  *(void **)((long)&local_8980->img_comp[0].linebuf + lVar37 * 2) = pvVar28;
                  if (pvVar28 == (void *)0x0) goto LAB_0015adb7;
                  uVar41 = (long)local_8980->img_h_max /
                           (long)*(int *)((long)&local_8980->img_comp[0].h + lVar37 * 2);
                  iVar16 = (int)uVar41;
                  *(int *)(pal[6] + lVar37) = iVar16;
                  iVar20 = local_8980->img_v_max /
                           *(int *)((long)&local_8980->img_comp[0].v + lVar37 * 2);
                  *(int *)(pal[7] + lVar37) = iVar20;
                  *(int *)(pal[9] + lVar37) = iVar20 >> 1;
                  *(int *)(pal[8] + lVar37) =
                       (int)((ulong)(iVar16 + (sVar17 - 1)) / (uVar41 & 0xffffffff));
                  psVar56 = pal[10] + lVar37;
                  psVar56[0] = '\0';
                  psVar56[1] = '\0';
                  psVar56[2] = '\0';
                  psVar56[3] = '\0';
                  uVar36 = *(undefined8 *)((long)&local_8980->img_comp[0].data + lVar37 * 2);
                  *(undefined8 *)(pal[4] + lVar37) = uVar36;
                  *(undefined8 *)(pal[2] + lVar37) = uVar36;
                  if (iVar16 == 2) {
                    pcVar35 = stbi__resample_row_h_2;
                    if (iVar20 != 1) {
                      if (iVar20 != 2) goto LAB_0015a75d;
                      pcVar35 = local_8980->resample_row_hv_2_kernel;
                    }
                  }
                  else if (iVar16 == 1) {
                    pcVar35 = stbi__resample_row_generic;
                    if (iVar20 == 2) {
                      pcVar35 = stbi__resample_row_v_2;
                    }
                    if (iVar20 == 1) {
                      pcVar35 = resample_row_1;
                    }
                  }
                  else {
LAB_0015a75d:
                    pcVar35 = stbi__resample_row_generic;
                  }
                  *(code **)(pal[0] + lVar37) = pcVar35;
                }
                sVar19 = psVar43->img_y;
                psVar29 = (stbi__context *)stbi__malloc_mad3(uVar23,sVar17,sVar19,1);
                if (psVar29 == (stbi__context *)0x0) {
LAB_0015adb7:
                  stbi__cleanup_jpeg(local_8980);
                  *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
                  psVar29 = (stbi__context *)0x0;
                }
                else {
                  iVar16 = 0;
                  for (uVar18 = 0; uVar18 < sVar19; uVar18 = uVar18 + 1) {
                    sVar17 = psVar43->img_x;
                    psVar56 = value;
                    for (lVar37 = 0; (ulong)uVar24 * 0x30 != lVar37; lVar37 = lVar37 + 0x30) {
                      iVar20 = *(int *)(pal[9] + lVar37);
                      iVar40 = *(int *)(pal[7] + lVar37);
                      iVar44 = iVar40 >> 1;
                      psVar54 = pal[4] + lVar37;
                      if (iVar20 < iVar44) {
                        psVar54 = pal[2] + lVar37;
                      }
                      psVar32 = pal[4] + lVar37;
                      if (iVar44 <= iVar20) {
                        psVar32 = pal[2] + lVar37;
                      }
                      uVar36 = (**(code **)(pal[0] + lVar37))
                                         (*(undefined8 *)
                                           ((long)&local_8980->img_comp[0].linebuf + lVar37 * 2),
                                          *(undefined8 *)psVar54,*(undefined8 *)psVar32,
                                          *(undefined4 *)(pal[8] + lVar37));
                      *(undefined8 *)psVar56 = uVar36;
                      *(int *)(pal[9] + lVar37) = iVar20 + 1;
                      if (iVar40 <= iVar20 + 1) {
                        psVar54 = pal[9] + lVar37;
                        psVar54[0] = '\0';
                        psVar54[1] = '\0';
                        psVar54[2] = '\0';
                        psVar54[3] = '\0';
                        lVar33 = *(long *)(pal[4] + lVar37);
                        *(long *)(pal[2] + lVar37) = lVar33;
                        iVar20 = *(int *)(pal[10] + lVar37) + 1;
                        *(int *)(pal[10] + lVar37) = iVar20;
                        if (iVar20 < *(int *)((long)&local_8980->img_comp[0].y + lVar37 * 2)) {
                          *(long *)(pal[4] + lVar37) =
                               lVar33 + *(int *)((long)&local_8980->img_comp[0].w2 + lVar37 * 2);
                        }
                      }
                      psVar56 = psVar56 + 8;
                    }
                    if ((int)uVar23 < 3) {
                      psVar43 = local_8980->s;
                      if (bVar57) {
                        uVar41 = (ulong)(sVar17 * iVar16);
                        if (uVar23 == 1) {
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            pbVar47[(long)(psVar29->buffer_start + uVar41 + -0x38)] =
                                 (byte)((uint)*pbVar47 * 0x1d +
                                        (uint)*pbVar47 * 0x96 + (uint)_value[(long)pbVar47] * 0x4d
                                       >> 8);
                          }
                        }
                        else {
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            psVar29->buffer_start[(long)pbVar47 * 2 + uVar41 + -0x38] =
                                 (stbi_uc)((uint)*pbVar47 * 0x1d +
                                           (uint)*pbVar47 * 0x96 +
                                           (uint)_value[(long)pbVar47] * 0x4d >> 8);
                            psVar29->buffer_start[(long)pbVar47 * 2 + uVar41 + 0xffffffffffffffc9] =
                                 0xff;
                          }
                        }
                      }
                      else if (psVar43->img_n == 4) {
                        if (local_8980->app14_color_transform == 2) {
                          psVar56 = psVar29->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffc9;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            iVar20 = (_value[(long)pbVar47] ^ 0xff) * (uint)*pbVar47;
                            psVar56[-1] = (char)((iVar20 + 0x80U >> 8) + iVar20 + 0x80 >> 8);
                            *psVar56 = 0xff;
                            psVar56 = psVar56 + uVar23;
                          }
                        }
                        else {
                          if (local_8980->app14_color_transform != 0) goto LAB_0015abf1;
                          psVar56 = psVar29->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffc9;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            bVar15 = *pbVar47;
                            iVar20 = (uint)_value[(long)pbVar47] * (uint)bVar15;
                            iVar40 = (uint)*pbVar47 * (uint)bVar15;
                            psVar56[-1] = (char)((((uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8) +
                                                  (uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8) * 0x1d
                                                 + (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x96 + (iVar20 + (iVar20 + 0x80U >> 8) + 0x80 >>
                                                          8) * 0x4d >> 8);
                            *psVar56 = 0xff;
                            psVar56 = psVar56 + uVar23;
                          }
                        }
                      }
                      else {
LAB_0015abf1:
                        uVar41 = (ulong)(sVar17 * iVar16);
                        if (uVar23 == 1) {
                          for (uVar52 = 0; uVar52 < psVar43->img_x; uVar52 = uVar52 + 1) {
                            psVar29->buffer_start[uVar52 + uVar41 + -0x38] = _value[uVar52];
                          }
                        }
                        else {
                          for (uVar52 = 0; uVar52 < psVar43->img_x; uVar52 = uVar52 + 1) {
                            psVar29->buffer_start[uVar52 * 2 + uVar41 + -0x38] = _value[uVar52];
                            psVar29->buffer_start[uVar52 * 2 + uVar41 + 0xffffffffffffffc9] = 0xff;
                          }
                        }
                      }
                    }
                    else {
                      psVar43 = local_8980->s;
                      if (psVar43->img_n == 3) {
                        if (bVar57) {
                          psVar56 = psVar29->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                          for (puVar45 = (undefined1 *)0x0;
                              puVar45 < (undefined1 *)(ulong)psVar43->img_x; puVar45 = puVar45 + 1)
                          {
                            psVar56[-3] = _value[(long)puVar45];
                            psVar56[-2] = *puVar45;
                            psVar56[-1] = *puVar45;
                            *psVar56 = 0xff;
                            psVar56 = psVar56 + uVar23;
                          }
                        }
                        else {
LAB_0015ac27:
                          (*local_8980->YCbCr_to_RGB_kernel)
                                    (psVar29->buffer_start +
                                     (ulong)(uVar18 * uVar23 * sVar17) + -0x38,_value,(stbi_uc *)0x0
                                     ,(stbi_uc *)0x0,psVar43->img_x,uVar23);
                        }
                      }
                      else if (psVar43->img_n == 4) {
                        if (local_8980->app14_color_transform == 2) {
                          (*local_8980->YCbCr_to_RGB_kernel)
                                    (psVar29->buffer_start +
                                     (ulong)(uVar18 * uVar23 * sVar17) + -0x38,_value,(stbi_uc *)0x0
                                     ,(stbi_uc *)0x0,psVar43->img_x,uVar23);
                          psVar43 = local_8980->s;
                          psVar56 = psVar29->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffca;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            bVar15 = *pbVar47;
                            iVar20 = (psVar56[-2] ^ 0xff) * (uint)bVar15;
                            psVar56[-2] = (byte)((iVar20 + 0x80U >> 8) + iVar20 + 0x80 >> 8);
                            iVar20 = (psVar56[-1] ^ 0xff) * (uint)bVar15;
                            psVar56[-1] = (byte)((iVar20 + 0x80U >> 8) + iVar20 + 0x80 >> 8);
                            iVar20 = (*psVar56 ^ 0xff) * (uint)bVar15;
                            *psVar56 = (byte)((iVar20 + 0x80U >> 8) + iVar20 + 0x80 >> 8);
                            psVar56 = psVar56 + uVar23;
                          }
                        }
                        else {
                          if (local_8980->app14_color_transform != 0) goto LAB_0015ac27;
                          psVar56 = psVar29->buffer_start +
                                    (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                          for (pbVar47 = (byte *)0x0; pbVar47 < (byte *)(ulong)psVar43->img_x;
                              pbVar47 = pbVar47 + 1) {
                            bVar15 = *pbVar47;
                            iVar20 = (uint)_value[(long)pbVar47] * (uint)bVar15;
                            psVar56[-3] = (char)((iVar20 + 0x80U >> 8) + iVar20 + 0x80 >> 8);
                            iVar20 = (uint)*pbVar47 * (uint)bVar15;
                            psVar56[-2] = (char)((iVar20 + 0x80U >> 8) + iVar20 + 0x80 >> 8);
                            psVar56[-1] = (char)(((uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8) +
                                                 (uint)*pbVar47 * (uint)bVar15 + 0x80 >> 8);
                            *psVar56 = 0xff;
                            psVar56 = psVar56 + uVar23;
                          }
                        }
                      }
                      else {
                        psVar56 = psVar29->buffer_start +
                                  (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                        for (uVar41 = 0; uVar41 < psVar43->img_x; uVar41 = uVar41 + 1) {
                          sVar9 = _value[uVar41];
                          psVar56[-1] = sVar9;
                          psVar56[-2] = sVar9;
                          psVar56[-3] = sVar9;
                          *psVar56 = 0xff;
                          psVar56 = psVar56 + uVar23;
                        }
                      }
                    }
                    psVar43 = local_8980->s;
                    sVar19 = psVar43->img_y;
                    iVar16 = iVar16 + uVar23;
                  }
                  stbi__cleanup_jpeg(local_8980);
                  psVar43 = local_8980->s;
                  *x = psVar43->img_x;
                  *y = psVar43->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar43->img_n) * 2 + 1;
                  }
                }
                goto LAB_00157dc2;
              }
            }
LAB_0015a25a:
            stbi__cleanup_jpeg(local_8980);
          }
          else {
            *(char **)(in_FS_OFFSET + -0x20) = "Internal error";
          }
          psVar29 = (stbi__context *)0x0;
          goto LAB_00157dc2;
        }
        goto LAB_0015942e;
      }
    }
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    if ((sVar9 == 'P') && (0xfd < (byte)(sVar10 - 0x37))) {
      y_00 = &s->img_y;
      comp_00 = &s->img_n;
      iVar16 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
      ri->bits_per_channel = iVar16;
      if (iVar16 == 0) {
        return (void *)0x0;
      }
      if ((0x1000000 < *y_00) || (0x1000000 < s->img_x)) goto LAB_00158550;
      *x = s->img_x;
      sVar17 = *y_00;
      *y = sVar17;
      iVar16 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar16;
        sVar17 = *y_00;
      }
      sVar19 = s->img_x;
      iVar40 = ri->bits_per_channel / 8;
      iVar44 = stbi__mad4sizes_valid(iVar16,sVar19,sVar17,iVar40,iVar20);
      if (iVar44 == 0) {
        pcVar27 = "PNM too large";
        goto LAB_001579e1;
      }
      psVar31 = (stbi__uint16 *)stbi__malloc_mad4(iVar16,sVar19,sVar17,iVar40,iVar20);
      if (psVar31 != (stbi__uint16 *)0x0) {
        iVar16 = stbi__getn(s,(stbi_uc *)psVar31,sVar17 * iVar16 * sVar19 * iVar40);
        if (iVar16 != 0) {
          if (req_comp == 0) {
            return psVar31;
          }
          iVar16 = *comp_00;
          if (iVar16 != req_comp) {
            if (ri->bits_per_channel == 0x10) {
              psVar31 = stbi__convert_format16(psVar31,iVar16,req_comp,s->img_x,s->img_y);
              return psVar31;
            }
            puVar34 = stbi__convert_format((uchar *)psVar31,iVar16,req_comp,s->img_x,s->img_y);
            return puVar34;
          }
          return psVar31;
        }
        free(psVar31);
        pcVar27 = "PNM file truncated";
        goto LAB_001579e1;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar16 = stbi__hdr_test(s);
      if (iVar16 == 0) {
        stbi__get8(s);
        bVar15 = stbi__get8(s);
        if (bVar15 < 2) {
          bVar11 = stbi__get8(s);
          if (bVar15 == 1) {
            if ((bVar11 & 0xf7) == 1) {
              iVar16 = 4;
              stbi__skip(s,4);
              bVar11 = stbi__get8(s);
              if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0))
              goto LAB_00159448;
            }
            goto LAB_00159327;
          }
          if ((bVar11 & 0xf6) != 2) goto LAB_00159327;
          iVar16 = 9;
LAB_00159448:
          stbi__skip(s,iVar16);
          iVar16 = stbi__get16le(s);
          if ((iVar16 == 0) || (iVar16 = stbi__get16le(s), iVar16 == 0)) goto LAB_00159327;
          bVar11 = stbi__get8(s);
          if (bVar15 != 1) {
            if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              goto LAB_001597c8;
            }
            goto LAB_00159327;
          }
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar11 - 8 & 0xf7) == 0) {
LAB_001597c8:
            bVar11 = stbi__get8(s);
            sVar9 = stbi__get8(s);
            bVar12 = stbi__get8(s);
            iVar16 = stbi__get16le(s);
            uVar26 = stbi__get16le(s);
            bVar15 = stbi__get8(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar18 = stbi__get16le(s);
            uVar23 = stbi__get16le(s);
            bVar13 = stbi__get8(s);
            pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
            bVar14 = stbi__get8(s);
            _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
            if (sVar9 == '\0') {
              uVar24 = bVar12 - 8;
              if (bVar12 < 8) {
                uVar24 = (uint)bVar12;
              }
              uVar24 = (uint)(uVar24 == 3);
              bVar15 = bVar13;
            }
            else {
              uVar24 = 0;
            }
            uVar24 = stbi__tga_get_comp((uint)bVar15,uVar24,(int *)pal);
            if (uVar24 == 0) {
              pcVar27 = "Can\'t find out TGA pixelformat";
              goto LAB_001579e1;
            }
            *x = uVar18;
            *y = uVar23;
            if (comp != (int *)0x0) {
              *comp = uVar24;
            }
            iVar20 = stbi__mad3sizes_valid(uVar18,uVar23,uVar24,0);
            if (iVar20 != 0) {
              local_8980 = (stbi__jpeg *)stbi__malloc_mad3(uVar18,uVar23,uVar24,0);
              if (local_8980 == (stbi__jpeg *)0x0) goto LAB_0015942e;
              stbi__skip(s,(uint)bVar11);
              uVar41 = (ulong)uVar24;
              if (((sVar9 == '\0') && (bVar12 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
                uVar49 = 0;
                uVar26 = uVar23;
                while (uVar26 = uVar26 - 1, uVar26 != 0xffffffff) {
                  uVar50 = uVar49;
                  if ((bVar14 >> 5 & 1) == 0) {
                    uVar50 = uVar26;
                  }
                  stbi__getn(s,local_8980->huff_dc[0].fast +
                               (long)(int)(uVar50 * uVar24 * uVar18) + -8,uVar24 * uVar18);
                  uVar49 = uVar49 + 1;
                }
              }
              else {
                if (sVar9 == '\0') {
                  local_8948 = (stbi__jpeg *)0x0;
                }
                else {
                  if (uVar26 == 0) {
LAB_0015b012:
                    free(local_8980);
                    goto LAB_0015b017;
                  }
                  stbi__skip(s,iVar16);
                  local_8948 = (stbi__jpeg *)stbi__malloc_mad2(uVar26,uVar24,0);
                  if (local_8948 == (stbi__jpeg *)0x0) goto LAB_00159429;
                  psVar30 = local_8948;
                  uVar49 = uVar26;
                  if (pal[0] == (stbi_uc  [4])0x0) {
                    iVar16 = stbi__getn(s,(stbi_uc *)local_8948,uVar24 * uVar26);
                    if (iVar16 == 0) {
                      free(local_8980);
                      local_8980 = local_8948;
                      goto LAB_0015b012;
                    }
                  }
                  else {
                    while (uVar49 != 0) {
                      stbi__tga_read_rgb16(s,(stbi_uc *)psVar30);
                      psVar30 = (stbi__jpeg *)(psVar30->huff_dc[0].fast + (uVar41 - 8));
                      uVar49 = uVar49 - 1;
                    }
                  }
                }
                bVar57 = true;
                iVar16 = 0;
                local_8978 = 0;
                psVar30 = local_8980;
                for (uVar52 = 0; uVar52 != uVar23 * uVar18; uVar52 = uVar52 + 1) {
                  if (bVar12 < 8) {
LAB_0015ae7e:
                    if (sVar9 == '\0') {
                      if (pal[0] == (stbi_uc  [4])0x0) {
                        for (uVar53 = 0; uVar41 != uVar53; uVar53 = uVar53 + 1) {
                          sVar10 = stbi__get8(s);
                          value[uVar53] = sVar10;
                        }
                      }
                      else {
                        stbi__tga_read_rgb16(s,value);
                      }
                    }
                    else {
                      if (bVar13 == 8) {
                        bVar15 = stbi__get8(s);
                        uVar49 = (uint)bVar15;
                      }
                      else {
                        uVar49 = stbi__get16le(s);
                      }
                      if (uVar26 <= uVar49) {
                        uVar49 = 0;
                      }
                      for (uVar53 = 0; uVar41 != uVar53; uVar53 = uVar53 + 1) {
                        value[uVar53] = local_8948->huff_dc[0].fast[uVar53 + uVar49 * uVar24 + -8];
                      }
                    }
                  }
                  else {
                    if (iVar16 == 0) {
                      bVar15 = stbi__get8(s);
                      iVar16 = (bVar15 & 0x7f) + 1;
                      local_8978 = (uint)(bVar15 >> 7);
                      goto LAB_0015ae7e;
                    }
                    if (local_8978 == 0 || bVar57) {
                      local_8978 = (uint)(local_8978 != 0);
                      goto LAB_0015ae7e;
                    }
                    local_8978 = 1;
                  }
                  for (uVar53 = 0; uVar41 != uVar53; uVar53 = uVar53 + 1) {
                    psVar30->huff_dc[0].fast[uVar53 - 8] = value[uVar53];
                  }
                  iVar16 = iVar16 + -1;
                  psVar30 = (stbi__jpeg *)(psVar30->huff_dc[0].fast + (uVar41 - 8));
                  bVar57 = false;
                }
                if ((bVar14 >> 5 & 1) == 0) {
                  iVar16 = uVar24 * uVar18;
                  iVar20 = (uVar23 - 1) * iVar16;
                  uVar26 = 0;
                  for (uVar49 = 0; uVar49 != uVar23 + 1 >> 1; uVar49 = uVar49 + 1) {
                    psVar30 = local_8980;
                    for (iVar40 = iVar16; 0 < iVar40; iVar40 = iVar40 + -1) {
                      sVar9 = psVar30->huff_dc[0].fast[(ulong)uVar26 - 8];
                      psVar30->huff_dc[0].fast[(ulong)uVar26 - 8] =
                           psVar30->huff_dc[0].fast[(long)iVar20 + -8];
                      psVar30->huff_dc[0].fast[(long)iVar20 + -8] = sVar9;
                      psVar30 = (stbi__jpeg *)((long)&psVar30->s + 1);
                    }
                    uVar26 = uVar26 + iVar16;
                    iVar20 = iVar20 - iVar16;
                  }
                }
                free(local_8948);
              }
              if ((2 < uVar24) && (pal[0] == (stbi_uc  [4])0x0)) {
                iVar16 = uVar23 * uVar18;
                puVar45 = (undefined1 *)((long)&local_8980->s + 2);
                while (bVar57 = iVar16 != 0, iVar16 = iVar16 + -1, bVar57) {
                  uVar3 = puVar45[-2];
                  puVar45[-2] = *puVar45;
                  *puVar45 = uVar3;
                  puVar45 = puVar45 + uVar41;
                }
              }
              if (req_comp == 0) {
                return local_8980;
              }
              if (uVar24 == req_comp) {
                return local_8980;
              }
LAB_00159e51:
              puVar34 = stbi__convert_format((uchar *)local_8980,uVar24,req_comp,uVar18,uVar23);
              return puVar34;
            }
LAB_0015b017:
            pcVar27 = "Corrupt TGA";
            goto LAB_001579e1;
          }
        }
        else {
LAB_00159327:
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        pcVar27 = "Image not of any known type, or corrupt";
        goto LAB_001579e1;
      }
      local_8980 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (local_8980 == (stbi__jpeg *)0x0) {
        return (void *)0x0;
      }
      iVar16 = *x;
      iVar20 = *y;
      psVar29 = (stbi__context *)stbi__malloc_mad3(iVar16,iVar20,req_comp,0);
      if (psVar29 != (stbi__context *)0x0) {
        uVar23 = (req_comp + (req_comp & 1U)) - 1;
        uVar18 = iVar20 * iVar16;
        uVar41 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          uVar41 = 0;
        }
        lVar37 = (long)req_comp;
        uVar52 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar52 = 0;
        }
        psVar43 = psVar29;
        psVar30 = local_8980;
        for (uVar53 = 0; uVar53 != uVar52; uVar53 = uVar53 + 1) {
          for (uVar42 = 0; uVar41 != uVar42; uVar42 = uVar42 + 1) {
            fVar58 = powf(*(float *)(psVar30->huff_dc[0].fast + uVar42 * 4 + -8) * stbi__h2l_scale_i
                          ,stbi__h2l_gamma_i);
            fVar59 = fVar58 * 255.0 + 0.5;
            fVar58 = 0.0;
            if (0.0 <= fVar59) {
              fVar58 = fVar59;
            }
            fVar59 = 255.0;
            if (fVar58 <= 255.0) {
              fVar59 = fVar58;
            }
            psVar43->buffer_start[uVar42 + -0x38] = (stbi_uc)(int)fVar59;
          }
          if ((int)uVar41 < req_comp) {
            lVar33 = uVar53 * lVar37 + uVar41;
            fVar59 = *(float *)(local_8980->huff_dc[0].fast + lVar33 * 4 + -8) * 255.0 + 0.5;
            fVar58 = 0.0;
            if (0.0 <= fVar59) {
              fVar58 = fVar59;
            }
            fVar59 = 255.0;
            if (fVar58 <= 255.0) {
              fVar59 = fVar58;
            }
            psVar29->buffer_start[lVar33 + -0x38] = (stbi_uc)(int)fVar59;
          }
          psVar43 = (stbi__context *)(psVar43->buffer_start + lVar37 + -0x38);
          psVar30 = (stbi__jpeg *)(psVar30->huff_dc[0].fast + lVar37 * 4 + -8);
        }
LAB_00157dc2:
        free(local_8980);
        return psVar29;
      }
LAB_00159429:
      free(local_8980);
    }
  }
LAB_0015942e:
  pcVar27 = "Out of memory";
LAB_001579e1:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar27;
  return (void *)0x0;
code_r0x001582b8:
  uVar24 = 4 - ((uVar26 & 0x10) == 0);
  if (comp != (int *)0x0) {
    *comp = uVar24;
  }
  for (uVar41 = 0; uVar41 != uVar23; uVar41 = uVar41 + 1) {
    psVar56 = local_8980->huff_dc[0].fast + (long)(int)(uVar18 * 4 * (int)uVar41) + -8;
    for (lVar33 = 0; lVar37 != lVar33; lVar33 = lVar33 + 1) {
      lVar6 = lVar33 * 3;
      sVar9 = pal[0][lVar6 + 1];
      psVar54 = psVar56;
      uVar26 = uVar18;
      if (sVar9 == '\0') {
        while (bVar57 = uVar26 != 0, uVar26 = uVar26 - 1, bVar57) {
          psVar32 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar54);
          if (psVar32 == (stbi_uc *)0x0) goto LAB_00159dfe;
          psVar54 = psVar54 + 4;
        }
      }
      else if (sVar9 == '\x01') {
        for (; 0 < (int)uVar26; uVar26 = uVar26 - (uVar49 & 0xff)) {
          bVar15 = stbi__get8(s);
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) {
            pcVar27 = "file too short (pure read count)";
            goto LAB_00159dec;
          }
          psVar32 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
          if (psVar32 == (stbi_uc *)0x0) goto LAB_00159dfe;
          uVar49 = (uint)bVar15;
          if (uVar26 < bVar15) {
            uVar49 = uVar26;
          }
          uVar50 = uVar49 & 0xff;
          while (bVar57 = uVar50 != 0, uVar50 = uVar50 - 1, bVar57) {
            stbi__copyval((uint)pal[0][lVar6 + 2],psVar54,value);
            psVar54 = psVar54 + 4;
          }
        }
      }
      else {
        if (sVar9 != '\x02') {
          pcVar27 = "packet has bad compression type";
LAB_0015addf:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar27;
          goto LAB_00159dfe;
        }
        for (; 0 < (int)uVar26; uVar26 = uVar26 - iVar20) {
          bVar15 = stbi__get8(s);
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) {
            pcVar27 = "file too short (mixed read count)";
LAB_00159dec:
            *(char **)(in_FS_OFFSET + -0x20) = pcVar27;
            goto LAB_00159dfe;
          }
          uVar49 = (uint)bVar15;
          if ((char)bVar15 < '\0') {
            if (uVar49 == 0x80) {
              iVar20 = stbi__get16be(s);
            }
            else {
              iVar20 = uVar49 - 0x7f;
            }
            if ((int)uVar26 < iVar20) {
LAB_0015a45c:
              pcVar27 = "scanline overrun";
              goto LAB_0015addf;
            }
            psVar32 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
            iVar16 = iVar20;
            if (psVar32 == (stbi_uc *)0x0) goto LAB_00159dfe;
            while (iVar16 != 0) {
              stbi__copyval((uint)pal[0][lVar6 + 2],psVar54,value);
              psVar54 = psVar54 + 4;
              iVar16 = iVar16 + -1;
            }
          }
          else {
            iVar20 = bVar15 + 1;
            iVar16 = iVar20;
            if (uVar26 <= uVar49) goto LAB_0015a45c;
            while (bVar57 = iVar16 != 0, iVar16 = iVar16 + -1, bVar57) {
              psVar32 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar54);
              if (psVar32 == (stbi_uc *)0x0) goto LAB_00159dfe;
              psVar54 = psVar54 + 4;
            }
          }
        }
      }
    }
  }
LAB_00159e24:
  *x = uVar18;
  *y = uVar23;
  bVar57 = req_comp != 0;
  if (bVar57) {
    uVar24 = req_comp;
  }
  req_comp = uVar24;
  if (!bVar57 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar24 = 4;
  goto LAB_00159e51;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}